

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall Tokenizer::peekToken(Tokenizer *this,int ahead)

{
  bool bVar1;
  Token *pTVar2;
  _List_node_base *p_Var3;
  iterator it;
  iterator local_28;
  
  p_Var3 = (this->position).it._M_node;
  if (0 < ahead) {
    do {
      local_28._M_node = p_Var3;
      bVar1 = processElement(this,&local_28);
      if (!bVar1) goto LAB_0014b2bd;
      p_Var3 = p_Var3->_M_next;
      ahead = ahead + -1;
    } while (ahead != 0);
  }
  local_28._M_node = p_Var3;
  bVar1 = processElement(this,&local_28);
  if (bVar1) {
    pTVar2 = (Token *)(p_Var3 + 1);
  }
  else {
LAB_0014b2bd:
    pTVar2 = &this->invalidToken;
  }
  return pTVar2;
}

Assistant:

const Token& Tokenizer::peekToken(int ahead)
{
	auto it = position.it;
	for (int i = 0; i < ahead; i++)
	{
		if (!processElement(it))
			return invalidToken;

		++it;
	}
	
	if (!processElement(it))
		return invalidToken;

	return *it;
}